

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheWrapString(xmlXPathParserContextPtr pctxt,xmlChar *val)

{
  xmlXPathContextPtr pxVar1;
  void *pvVar2;
  xmlXPathContextCachePtr cache;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  xmlChar *val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  pxVar1 = pctxt->context;
  if (((pxVar1 == (xmlXPathContextPtr)0x0) || (pxVar1->cache == (void *)0x0)) ||
     (pvVar2 = pxVar1->cache, *(long *)((long)pvVar2 + 8) == 0)) {
    pctxt_local = (xmlXPathParserContextPtr)xmlXPathWrapString(val);
    if (pctxt_local == (xmlXPathParserContextPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    pctxt_local = *(xmlXPathParserContextPtr *)((long)pvVar2 + 8);
    *(xmlXPathObjectPtr *)((long)pvVar2 + 8) = pctxt_local->value;
    *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) + -1;
    *(undefined4 *)&pctxt_local->cur = 4;
    pctxt_local->value = (xmlXPathObjectPtr)val;
  }
  return (xmlXPathObjectPtr)pctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapString(xmlXPathParserContextPtr pctxt, xmlChar *val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
	    ret->type = XPATH_STRING;
	    ret->stringval = val;
	    return(ret);
	}
    }

    ret = xmlXPathWrapString(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}